

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

PktOut * ssh1_bpp_new_pktout(int pkt_type)

{
  PktOut *pPVar1;
  PktOut *pkt;
  int pkt_type_local;
  
  pPVar1 = ssh_new_packet();
  pPVar1->length = 0xc;
  BinarySink_put_byte(pPVar1->binarysink_,(uchar)pkt_type);
  pPVar1->prefix = pPVar1->length;
  pPVar1->type = pkt_type;
  pPVar1->downstream_id = 0;
  pPVar1->additional_log_text = (char *)0x0;
  return pPVar1;
}

Assistant:

static PktOut *ssh1_bpp_new_pktout(int pkt_type)
{
    PktOut *pkt = ssh_new_packet();
    pkt->length = 4 + 8;            /* space for length + max padding */
    put_byte(pkt, pkt_type);
    pkt->prefix = pkt->length;
    pkt->type = pkt_type;
    pkt->downstream_id = 0;
    pkt->additional_log_text = NULL;
    return pkt;
}